

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLint GVar6;
  GLint GVar7;
  int iVar8;
  GLFWwindow *handle;
  long lVar9;
  GLuint *pGVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  GLfloat x;
  float fVar15;
  uint extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined1 auVar16 [16];
  undefined1 auVar17 [12];
  float fVar18;
  double local_2088;
  int height;
  double local_2070;
  float local_2068;
  uint uStack_2064;
  uint uStack_2060;
  uint uStack_205c;
  ulong local_2050;
  double local_2048;
  GLsizei log_length;
  int width;
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    glfwWindowHint(0x20003,0);
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,2);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x22006,1);
    handle = glfwCreateWindow(800,600,"GLFW OpenGL3 Heightmap demo",(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwSetKeyCallback(handle,key_callback);
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      GVar3 = make_shader(0x8b31,
                          "#version 150\nuniform mat4 project;\nuniform mat4 modelview;\nin float x;\nin float y;\nin float z;\n\nvoid main()\n{\n   gl_Position = project * modelview * vec4(x, y, z, 1.0);\n}\n"
                         );
      if (GVar3 == 0) {
        fwrite("ERROR: Unable to load vertex shader\n",0x24,1,_stderr);
      }
      else {
        GVar4 = make_shader(0x8b30,
                            "#version 150\nout vec4 color;\nvoid main()\n{\n    color = vec4(0.2, 1.0, 0.2, 1.0); \n}\n"
                           );
        if (GVar4 == 0) {
          fwrite("ERROR: Unable to load fragment shader\n",0x26,1,_stderr);
          (*glad_glDeleteShader)(GVar3);
        }
        else {
          GVar5 = (*glad_glCreateProgram)();
          if (GVar5 != 0) {
            (*glad_glAttachShader)(GVar5,GVar3);
            (*glad_glAttachShader)(GVar5,GVar4);
            (*glad_glLinkProgram)(GVar5);
            (*glad_glGetProgramiv)(GVar5,0x8b82,&height);
            if (height == 1) {
              (*glad_glUseProgram)(GVar5);
              GVar6 = (*glad_glGetUniformLocation)(GVar5,"project");
              GVar7 = (*glad_glGetUniformLocation)(GVar5,"modelview");
              projection_matrix[0] = 1.3444432;
              projection_matrix[5] = 1.792591;
              projection_matrix[10] = -1.020202;
              projection_matrix[0xb] = -1.0;
              projection_matrix[0xe] = -2.020202;
              (*glad_glUniformMatrix4fv)(GVar6,1,'\0',projection_matrix);
              modelview_matrix[0xc] = -5.0;
              modelview_matrix[0xd] = -5.0;
              modelview_matrix[0xe] = -20.0;
              (*glad_glUniformMatrix4fv)(GVar7,1,'\0',modelview_matrix);
              fVar15 = 0.0;
              lVar9 = 0x15eaa0;
              for (iVar2 = 0; iVar2 != 0x50; iVar2 = iVar2 + 1) {
                fVar18 = 0.0;
                for (lVar11 = 0; lVar11 != 0x50; lVar11 = lVar11 + 1) {
                  *(float *)(lVar9 + -0xc800 + lVar11 * 4) = fVar15;
                  *(undefined4 *)(lVar9 + -0x6400 + lVar11 * 4) = 0;
                  *(float *)(lVar9 + lVar11 * 4) = fVar18;
                  fVar18 = fVar18 + 0.12658228;
                }
                fVar15 = fVar15 + 0.12658228;
                lVar9 = lVar9 + 0x140;
              }
              pGVar10 = map_line_indices + 1;
              for (GVar3 = 0x9f; GVar3 != 0x194f; GVar3 = GVar3 + 0x50) {
                pGVar10[-1] = GVar3 - 0x50;
                *pGVar10 = GVar3;
                pGVar10 = pGVar10 + 2;
              }
              for (lVar9 = 0; iVar2 = (int)lVar9, iVar2 != 0x4f; lVar9 = lVar9 + 1) {
                map_line_indices[lVar9 * 2 + 0x9e] = iVar2 + 0x18b0;
                map_line_indices[lVar9 * 2 + 0x9f] = iVar2 + 0x18b1;
              }
              lVar9 = 0x13c;
              iVar2 = 0;
              for (iVar12 = 0; iVar12 != 0x4f; iVar12 = iVar12 + 1) {
                lVar9 = (long)(int)lVar9;
                for (iVar13 = 0; iVar13 != 0x4f; iVar13 = iVar13 + 1) {
                  GVar3 = iVar2 + iVar13;
                  map_line_indices[lVar9] = GVar3;
                  map_line_indices[lVar9 + 1] = iVar2 + iVar13 + 1;
                  map_line_indices[lVar9 + 2] = GVar3;
                  map_line_indices[lVar9 + 3] = iVar2 + 0x50 + iVar13;
                  map_line_indices[lVar9 + 4] = GVar3;
                  map_line_indices[lVar9 + 5] = iVar2 + iVar13 + 0x51;
                  lVar9 = lVar9 + 6;
                }
                iVar2 = iVar2 + 0x50;
              }
              (*glad_glGenVertexArrays)(1,&mesh);
              (*glad_glGenBuffers)(4,mesh_vbo);
              (*glad_glBindVertexArray)(mesh);
              (*glad_glBindBuffer)(0x8893,mesh_vbo[3]);
              (*glad_glBufferData)(0x8893,0x24e08,map_line_indices,0x88e4);
              GVar3 = (*glad_glGetAttribLocation)(GVar5,"x");
              (*glad_glBindBuffer)(0x8892,mesh_vbo[0]);
              (*glad_glBufferData)(0x8892,0x6400,map_vertices,0x88e4);
              (*glad_glEnableVertexAttribArray)(GVar3);
              uVar14 = 0;
              (*glad_glVertexAttribPointer)(GVar3,1,0x1406,'\0',0,(void *)0x0);
              GVar3 = (*glad_glGetAttribLocation)(GVar5,"z");
              (*glad_glBindBuffer)(0x8892,mesh_vbo[2]);
              (*glad_glBufferData)(0x8892,0x6400,map_vertices + 2,0x88e4);
              (*glad_glEnableVertexAttribArray)(GVar3);
              (*glad_glVertexAttribPointer)(GVar3,1,0x1406,'\0',0,(void *)0x0);
              GVar3 = (*glad_glGetAttribLocation)(GVar5,"y");
              (*glad_glBindBuffer)(0x8892,mesh_vbo[1]);
              (*glad_glBufferData)(0x8892,0x6400,map_vertices + 1,0x88e8);
              (*glad_glEnableVertexAttribArray)(GVar3);
              (*glad_glVertexAttribPointer)(GVar3,1,0x1406,'\0',0,(void *)0x0);
              glfwGetFramebufferSize(handle,&width,&height);
              (*glad_glViewport)(0,0,width,height);
              (*glad_glClearColor)(0.0,0.0,0.0,0.0);
              local_2070 = glfwGetTime();
              do {
                local_2088 = local_2070;
                do {
                  iVar2 = glfwWindowShouldClose(handle);
                  if (iVar2 != 0) {
                    glfwTerminate();
                    exit(0);
                  }
                  (*glad_glClear)(0x4000);
                  (*glad_glDrawElements)(1,0x9382,0x1405,(void *)0x0);
                  glfwSwapBuffers(handle);
                  glfwPollEvents();
                  dVar1 = glfwGetTime();
                  auVar16._12_4_ = extraout_XMM0_Dd;
                  auVar16._8_4_ = extraout_XMM0_Dc;
                  auVar16._0_8_ = dVar1 - local_2088;
                  auVar17 = auVar16._4_12_;
                } while ((auVar16._0_8_ <= 0.2) || (local_2088 = dVar1, 199 < (uint)uVar14));
                local_2070 = dVar1;
                local_2050 = uVar14;
                iVar2 = rand();
                iVar12 = rand();
                iVar13 = rand();
                iVar8 = rand();
                local_2068 = (float)iVar8 * 4.656613e-10;
                uStack_2064 = extraout_XMM0_Db;
                uStack_2060 = extraout_XMM0_Dc_00;
                uStack_205c = extraout_XMM0_Dd_00;
                iVar8 = rand();
                uStack_2064 = (auVar17._0_4_ ^ 0x80000000) & uStack_2064 |
                              ~uStack_2064 & auVar17._0_4_;
                uStack_2060 = (auVar17._4_4_ ^ 0x80000000) & uStack_2060 |
                              ~uStack_2060 & auVar17._4_4_;
                uStack_205c = (auVar17._8_4_ ^ 0x80000000) & uStack_205c |
                              ~uStack_205c & auVar17._8_4_;
                local_2068 = (float)((uint)-(float)iVar8 & -(uint)(local_2068 < 0.3) |
                                    ~-(uint)(local_2068 < 0.3) & (uint)(float)iVar8) * 4.656613e-10
                             * 0.5;
                local_2048 = (double)local_2068;
                for (lVar9 = -0x1900; lVar9 != 0; lVar9 = lVar9 + 1) {
                  fVar15 = (float)iVar2 * 10.0 * 4.656613e-10 - map_vertices[1][lVar9];
                  fVar18 = (float)iVar12 * 10.0 * 4.656613e-10 - (float)map_line_indices[lVar9];
                  fVar15 = SQRT(fVar15 * fVar15 + fVar18 * fVar18);
                  fVar15 = (fVar15 + fVar15) / ((float)iVar13 * 5.0 * 4.656613e-10);
                  if (ABS(fVar15) <= 1.0) {
                    dVar1 = cos((double)(fVar15 * 3.14));
                    map_vertices[2][lVar9] =
                         (float)(dVar1 * local_2048) + local_2068 + map_vertices[2][lVar9];
                  }
                }
                (*glad_glBufferSubData)(0x8892,0,0x6400,map_vertices + 1);
                uVar14 = (ulong)((int)local_2050 + 1);
              } while( true );
            }
            fwrite("ERROR, failed to link shader program\n",0x25,1,_stderr);
            (*glad_glGetProgramInfoLog)(GVar5,0x2000,&log_length,(GLchar *)&width);
            fprintf(_stderr,"ERROR: \n%s\n\n",&width);
            (*glad_glDeleteProgram)(GVar5);
            (*glad_glDeleteShader)(GVar4);
            (*glad_glDeleteShader)(GVar3);
          }
        }
      }
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWwindow* window;
    int iter;
    double dt;
    double last_update_time;
    int frame;
    float f;
    GLint uloc_modelview;
    GLint uloc_project;
    int width, height;

    GLuint shader_program;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_RESIZABLE, GLFW_FALSE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_TRUE);

    window = glfwCreateWindow(800, 600, "GLFW OpenGL3 Heightmap demo", NULL, NULL);
    if (! window )
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    /* Register events callback */
    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);

    /* Prepare opengl resources for rendering */
    shader_program = make_shader_program(vertex_shader_text, fragment_shader_text);

    if (shader_program == 0u)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glUseProgram(shader_program);
    uloc_project   = glGetUniformLocation(shader_program, "project");
    uloc_modelview = glGetUniformLocation(shader_program, "modelview");

    /* Compute the projection matrix */
    f = 1.0f / tanf(view_angle / 2.0f);
    projection_matrix[0]  = f / aspect_ratio;
    projection_matrix[5]  = f;
    projection_matrix[10] = (z_far + z_near)/ (z_near - z_far);
    projection_matrix[11] = -1.0f;
    projection_matrix[14] = 2.0f * (z_far * z_near) / (z_near - z_far);
    glUniformMatrix4fv(uloc_project, 1, GL_FALSE, projection_matrix);

    /* Set the camera position */
    modelview_matrix[12]  = -5.0f;
    modelview_matrix[13]  = -5.0f;
    modelview_matrix[14]  = -20.0f;
    glUniformMatrix4fv(uloc_modelview, 1, GL_FALSE, modelview_matrix);

    /* Create mesh data */
    init_map();
    make_mesh(shader_program);

    /* Create vao + vbo to store the mesh */
    /* Create the vbo to store all the information for the grid and the height */

    /* setup the scene ready for rendering */
    glfwGetFramebufferSize(window, &width, &height);
    glViewport(0, 0, width, height);
    glClearColor(0.0f, 0.0f, 0.0f, 0.0f);

    /* main loop */
    frame = 0;
    iter = 0;
    last_update_time = glfwGetTime();

    while (!glfwWindowShouldClose(window))
    {
        ++frame;
        /* render the next frame */
        glClear(GL_COLOR_BUFFER_BIT);
        glDrawElements(GL_LINES, 2* MAP_NUM_LINES , GL_UNSIGNED_INT, 0);

        /* display and process events through callbacks */
        glfwSwapBuffers(window);
        glfwPollEvents();
        /* Check the frame rate and update the heightmap if needed */
        dt = glfwGetTime();
        if ((dt - last_update_time) > 0.2)
        {
            /* generate the next iteration of the heightmap */
            if (iter < MAX_ITER)
            {
                update_map(NUM_ITER_AT_A_TIME);
                update_mesh();
                iter += NUM_ITER_AT_A_TIME;
            }
            last_update_time = dt;
            frame = 0;
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}